

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::StmtBlock::add_stmt(StmtBlock *this,shared_ptr<kratos::Stmt> *stmt)

{
  allocator<kratos::IRNode_*> *this_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  initializer_list<kratos::IRNode_*> __l_03;
  bool bVar1;
  StatementType SVar2;
  AssignmentType AVar3;
  StmtException *pSVar4;
  element_type *peVar5;
  element_type *peVar6;
  allocator<kratos::IRNode_*> local_251;
  StmtBlock *local_250;
  element_type *local_248;
  StmtBlock **local_240;
  size_type local_238;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_230;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1ea;
  allocator<kratos::IRNode_*> local_1e9;
  StmtBlock *local_1e8;
  element_type *local_1e0;
  StmtBlock **local_1d8;
  size_type local_1d0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_1c8;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  StmtBlock *local_170;
  element_type *local_168;
  StmtBlock **local_160;
  size_type local_158;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_150;
  allocator<char> local_131;
  string local_130;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_110;
  IRNode *local_108;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_100;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  local_f8;
  undefined1 local_ea;
  allocator<kratos::IRNode_*> local_e9;
  StmtBlock *local_e8;
  element_type *local_e0;
  _Base_ptr local_d8;
  size_type local_d0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_c8;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_82;
  allocator<kratos::IRNode_*> local_81;
  StmtBlock *local_80;
  StmtBlock **local_78;
  size_type local_70;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_68;
  allocator<char> local_39;
  string local_38;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *local_18;
  shared_ptr<kratos::Stmt> *stmt_local;
  StmtBlock *this_local;
  
  local_18 = &stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  stmt_local = (shared_ptr<kratos::Stmt> *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stmt);
  if (!bVar1) {
    local_82 = 1;
    pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unable to add nullptr (None) to code block",&local_39);
    local_78 = &local_80;
    local_70 = 1;
    local_80 = this;
    std::allocator<kratos::IRNode_*>::allocator(&local_81);
    __l_03._M_len = local_70;
    __l_03._M_array = (iterator)local_78;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_68,__l_03,&local_81);
    StmtException::StmtException(pSVar4,&local_38,&local_68);
    local_82 = 0;
    __cxa_throw(pSVar4,&StmtException::typeinfo,StmtException::~StmtException);
  }
  peVar5 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_18);
  SVar2 = Stmt::type(peVar5);
  if (SVar2 == Block) {
    local_ea = 1;
    pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"cannot add statement block to another statement block",&local_a9
              );
    local_e8 = this;
    local_e0 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
    local_d8 = (_Base_ptr)&local_e8;
    local_d0 = 2;
    std::allocator<kratos::IRNode_*>::allocator(&local_e9);
    __l_02._M_len = local_d0;
    __l_02._M_array = (iterator)local_d8;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_c8,__l_02,&local_e9);
    StmtException::StmtException(pSVar4,&local_a8,&local_c8);
    local_ea = 0;
    __cxa_throw(pSVar4,&StmtException::typeinfo,StmtException::~StmtException);
  }
  local_100._M_current =
       (shared_ptr<kratos::Stmt> *)
       std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
       begin(&this->stmts_);
  local_108 = (IRNode *)
              std::
              vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ::end(&this->stmts_);
  local_f8 = std::
             find<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,std::shared_ptr<kratos::Stmt>>
                       (local_100,
                        (__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                         )local_108,(shared_ptr<kratos::Stmt> *)local_18);
  local_110._M_current =
       (shared_ptr<kratos::Stmt> *)
       std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
       end(&this->stmts_);
  bVar1 = __gnu_cxx::operator!=(&local_f8,&local_110);
  if (bVar1) {
    assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._6_1_ = 1;
    pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Cannot add the same block to the block list",&local_131);
    local_170 = this;
    local_168 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
    local_160 = &local_170;
    local_158 = 2;
    this_00 = (allocator<kratos::IRNode_*> *)
              ((long)&assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + 7);
    std::allocator<kratos::IRNode_*>::allocator(this_00);
    __l_01._M_len = local_158;
    __l_01._M_array = (iterator)local_160;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_150,__l_01,this_00);
    StmtException::StmtException(pSVar4,&local_130,&local_150);
    assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._6_1_ = 0;
    __cxa_throw(pSVar4,&StmtException::typeinfo,StmtException::~StmtException);
  }
  peVar5 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_18);
  SVar2 = Stmt::type(peVar5);
  if (SVar2 == Assign) {
    std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_18);
    Stmt::as<kratos::AssignStmt>((Stmt *)local_188);
    peVar6 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_188);
    AVar3 = AssignStmt::assign_type(peVar6);
    if (AVar3 != Undefined) {
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_188);
      AVar3 = AssignStmt::assign_type(peVar6);
      if ((AVar3 == NonBlocking) && (this->block_type_ == Combinational)) {
        local_1ea = 1;
        pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"cannot add blocking assignment to a sequential block",
                   &local_1a9);
        local_1e8 = this;
        local_1e0 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
        local_1d8 = &local_1e8;
        local_1d0 = 2;
        std::allocator<kratos::IRNode_*>::allocator(&local_1e9);
        __l_00._M_len = local_1d0;
        __l_00._M_array = (iterator)local_1d8;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_1c8,__l_00,&local_1e9);
        StmtException::StmtException(pSVar4,&local_1a8,&local_1c8);
        local_1ea = 0;
        __cxa_throw(pSVar4,&StmtException::typeinfo,StmtException::~StmtException);
      }
      peVar6 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_188);
      AVar3 = AssignStmt::assign_type(peVar6);
      if ((AVar3 == Blocking) && (this->block_type_ == Sequential)) {
        pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,
                   "cannot add non-blocking assignment to a combinational block",&local_211);
        local_250 = this;
        local_248 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
        local_240 = &local_250;
        local_238 = 2;
        std::allocator<kratos::IRNode_*>::allocator(&local_251);
        __l._M_len = local_238;
        __l._M_array = (iterator)local_240;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_230,__l,&local_251);
        StmtException::StmtException(pSVar4,&local_210,&local_230);
        __cxa_throw(pSVar4,&StmtException::typeinfo,StmtException::~StmtException);
      }
    }
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_188);
  }
  peVar5 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_18);
  (*(peVar5->super_IRNode)._vptr_IRNode[7])(peVar5,this);
  std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
  emplace_back<std::shared_ptr<kratos::Stmt>const&>
            ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *)
             &this->stmts_,(shared_ptr<kratos::Stmt> *)local_18);
  return;
}

Assistant:

void StmtBlock::add_stmt(const std::shared_ptr<Stmt> &stmt) {
    if (!stmt) throw StmtException("Unable to add nullptr (None) to code block", {this});
    // it cannot add another block stmt
    if (stmt->type() == StatementType::Block) {
        throw StmtException("cannot add statement block to another statement block",
                            {this, stmt.get()});
    }
    if (std::find(stmts_.begin(), stmts_.end(), stmt) != stmts_.end()) {
        throw StmtException("Cannot add the same block to the block list", {this, stmt.get()});
    }
    // if it is an assign statement, check the assignment as well
    if (stmt->type() == StatementType::Assign) {
        auto assign_stmt = stmt->as<AssignStmt>();
        if (assign_stmt->assign_type() == AssignmentType::Undefined) {
            // let the passes to figure this out
        } else if (assign_stmt->assign_type() == AssignmentType::NonBlocking &&
                   block_type_ == StatementBlockType::Combinational) {
            throw StmtException("cannot add blocking assignment to a sequential block",
                                {this, stmt.get()});
        } else if (assign_stmt->assign_type() == AssignmentType::Blocking &&
                   block_type_ == StatementBlockType::Sequential) {
            throw StmtException("cannot add non-blocking assignment to a combinational block",
                                {this, stmt.get()});
        }
    }
    stmt->set_parent(this);
    stmts_.emplace_back(stmt);
}